

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture1DView *src,float *texCoord,ReferenceParams *params)

{
  Texture1DView TVar1;
  undefined1 local_48 [8];
  Vec4 sq;
  Texture1DView view;
  ReferenceParams *params_local;
  float *texCoord_local;
  Texture1DView *src_local;
  SurfaceAccess *dst_local;
  
  TVar1 = getSubView(src,params->baseLevel,params->maxLevel);
  sq.m_data[2] = (float)TVar1.m_numLevels;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_48,*texCoord,texCoord[1],texCoord[2],texCoord[3]);
  if (((params->super_RenderParams).flags & 1) == 0) {
    sampleTextureNonProjected(dst,(Texture1DView *)(sq.m_data + 2),(Vec4 *)local_48,params);
  }
  else {
    sampleTextureProjected(dst,(Texture1DView *)(sq.m_data + 2),(Vec4 *)local_48,params);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture1DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture1DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, params);
	else
		sampleTextureNonProjected(dst, view, sq, params);
}